

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinselector_tests.cpp
# Opt level: O1

void __thiscall
wallet::coinselector_tests::effective_value_test::test_method(effective_value_test *this)

{
  optional<CFeeRate> feerate;
  optional<CFeeRate> feerate_00;
  optional<CFeeRate> feerate_01;
  pointer pCVar1;
  element_type *peVar2;
  iterator pvVar3;
  iterator pvVar4;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  _func_int **local_508;
  assertion_result local_500;
  char *local_4e8;
  undefined1 *local_4e0;
  undefined1 *local_4d8;
  char *local_4d0;
  char *local_4c8;
  undefined1 *local_4c0;
  undefined1 *local_4b8;
  char *local_4b0;
  char *local_4a8;
  undefined1 *local_4a0;
  undefined1 *local_498;
  char *local_490;
  char *local_488;
  CAmount expected_ev3;
  undefined1 *local_478;
  undefined1 *local_470;
  char *local_468;
  char *local_460;
  undefined1 *local_458;
  undefined1 *local_450;
  char *local_448;
  char *local_440;
  CAmount expected_ev1;
  CMutableTransaction tx;
  CAmount nValue;
  _Storage<long,_true> local_3f0;
  _Storage<long,_true> local_3e8;
  _Storage<long,_true> local_3e0;
  char *local_3d8;
  _Storage<long,_true> local_3d0;
  char *local_3c8;
  shared_count sStack_3c0;
  undefined8 local_3b8;
  undefined1 uStack_3b0;
  undefined7 uStack_3af;
  undefined8 local_3a8;
  undefined1 uStack_3a0;
  undefined7 uStack_39f;
  _Storage<CFeeRate,_true> local_398;
  char *pcStack_390;
  shared_count sStack_388;
  _Storage<long,_true> local_380;
  undefined1 local_378 [8];
  element_type *peStack_370;
  shared_count sStack_368;
  _Storage<long,_true> *p_Stack_360;
  undefined8 local_358;
  element_type *peStack_350;
  sp_counted_base *local_348;
  _Storage<long,_true> *p_Stack_340;
  undefined4 local_338;
  CAmount local_330;
  direct_or_indirect local_328;
  uint local_30c;
  undefined8 local_308;
  undefined2 local_300;
  undefined1 local_2fe;
  undefined8 local_2f8;
  undefined1 local_2f0;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  COutput output4;
  COutput output3;
  _Storage<long,_true> local_198;
  uint uStack_190;
  undefined4 uStack_18c;
  _Storage<long,_true> local_188;
  _Storage<CFeeRate,_true> *p_Stack_180;
  _Storage<long,_true> local_178;
  undefined8 uStack_170;
  _Storage<long,_true> local_168;
  bool bStack_160;
  undefined7 uStack_15f;
  undefined4 local_158;
  CAmount local_150;
  direct_or_indirect local_148;
  uint local_12c;
  undefined8 local_128;
  undefined2 local_120;
  undefined1 local_11e;
  undefined8 local_118;
  undefined1 local_110;
  undefined8 local_108;
  undefined8 uStack_100;
  COutput output1;
  undefined1 local_58 [8];
  element_type *peStack_50;
  shared_count sStack_48;
  _Storage<long,_true> *p_Stack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  nValue = 10000;
  CMutableTransaction::CMutableTransaction(&tx);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::resize(&tx.vout,1);
  (tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
  _M_start)->nValue = 10000;
  CMutableTransaction::GetHash((Txid *)&output3,&tx);
  local_188 = output3.fee.super__Optional_base<long,_true,_true>._M_payload.
              super__Optional_payload_base<long>._M_payload;
  p_Stack_180 = (_Storage<CFeeRate,_true> *)
                output3.fee.super__Optional_base<long,_true,_true>._M_payload.
                super__Optional_payload_base<long>._8_8_;
  local_198 = output3.effective_value.super__Optional_base<long,_true,_true>._M_payload.
              super__Optional_payload_base<long>._M_payload;
  uStack_190 = output3.effective_value.super__Optional_base<long,_true,_true>._M_payload.
               super__Optional_payload_base<long>._8_4_;
  uStack_18c = output3.effective_value.super__Optional_base<long,_true,_true>._M_payload.
               super__Optional_payload_base<long>._12_4_;
  local_178._M_value = (ulong)(uint)local_178._4_4_ << 0x20;
  if (tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_007bd8e0;
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
  }
  else {
    local_3a8 = 1000;
    uStack_3a0 = 1;
    feerate.super__Optional_base<CFeeRate,_true,_true>._M_payload.
    super__Optional_payload_base<CFeeRate>._9_7_ = uStack_39f;
    feerate.super__Optional_base<CFeeRate,_true,_true>._M_payload.
    super__Optional_payload_base<CFeeRate>._M_engaged = true;
    pvVar3 = (iterator)0x94;
    pvVar4 = (iterator)0x1;
    feerate.super__Optional_base<CFeeRate,_true,_true>._M_payload.
    super__Optional_payload_base<CFeeRate>._M_payload = (_Storage<CFeeRate,_true>)0x3e8;
    COutput::COutput(&output1,(COutPoint *)&local_198,
                     tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                     super__Vector_impl_data._M_start,1,0x94,true,true,true,0,false,feerate);
    expected_ev1 = 0x267c;
    local_448 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
    ;
    local_440 = "";
    local_458 = &boost::unit_test::basic_cstring<char_const>::null;
    local_450 = &boost::unit_test::basic_cstring<char_const>::null;
    file.m_end = (iterator)0x434;
    file.m_begin = (iterator)&local_448;
    msg.m_end = pvVar4;
    msg.m_begin = pvVar3;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_458,msg);
    output4.effective_value.super__Optional_base<long,_true,_true>._M_payload.
    super__Optional_payload_base<long>._8_4_ =
         output4.effective_value.super__Optional_base<long,_true,_true>._M_payload.
         super__Optional_payload_base<long>._8_4_ & 0xffffff00;
    output4.effective_value.super__Optional_base<long,_true,_true>._M_payload.
    super__Optional_payload_base<long>._M_payload._M_value = (long)&PTR__lazy_ostream_013abb30;
    output4.fee.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>
    ._M_payload._M_value = (long)boost::unit_test::lazy_ostream::inst;
    output4.fee.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>
    ._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
    if (output1.effective_value.super__Optional_base<long,_true,_true>._M_payload.
        super__Optional_payload_base<long>._M_engaged != false) {
      local_398 = (_Storage<CFeeRate,_true>)&local_3d0;
      local_500._0_8_ = &expected_ev1;
      local_378[0] = output1.effective_value.super__Optional_base<long,_true,_true>._M_payload.
                     super__Optional_payload_base<long>._M_payload._M_value == expected_ev1;
      local_3d0 = output1.effective_value.super__Optional_base<long,_true,_true>._M_payload.
                  super__Optional_payload_base<long>._M_payload;
      peStack_370 = (element_type *)0x0;
      sStack_368.pi_ = (sp_counted_base *)0x0;
      local_58 = (undefined1  [8])0xf8004b;
      peStack_50 = (element_type *)0xf800bd;
      p_Stack_180 = &local_398;
      uStack_190 = uStack_190 & 0xffffff00;
      local_198._M_value = (long)&PTR__lazy_ostream_013abed0;
      local_188._M_value = (long)boost::unit_test::lazy_ostream::inst;
      output3.effective_value.super__Optional_base<long,_true,_true>._M_payload.
      super__Optional_payload_base<long>._8_4_ =
           output3.effective_value.super__Optional_base<long,_true,_true>._M_payload.
           super__Optional_payload_base<long>._8_4_ & 0xffffff00;
      output3.effective_value.super__Optional_base<long,_true,_true>._M_payload.
      super__Optional_payload_base<long>._M_payload._M_value = (long)&PTR__lazy_ostream_013abed0;
      output3.fee.super__Optional_base<long,_true,_true>._M_payload.
      super__Optional_payload_base<long>._M_payload._M_value =
           (long)boost::unit_test::lazy_ostream::inst;
      pvVar3 = (iterator)0x1;
      pvVar4 = (iterator)0x2;
      output3.fee.super__Optional_base<long,_true,_true>._M_payload.
      super__Optional_payload_base<long>._8_8_ = &local_500;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_378,(lazy_ostream *)&output4,1,2,REQUIRE,0xf80fd1,
                 (size_t)local_58,0x434,&local_198,"expected_ev1",&output3);
      boost::detail::shared_count::~shared_count(&sStack_368);
      CMutableTransaction::GetHash((Txid *)&output3,&tx);
      pCVar1 = tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
          super__Vector_impl_data._M_start) {
        if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_007bd8e0;
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
      }
      else {
        uStack_190 = uStack_190 & 0xffffff00;
        p_Stack_180 = (_Storage<CFeeRate,_true> *)((ulong)p_Stack_180 & 0xffffffffffffff00);
        uStack_170 = CONCAT44(output3.effective_value.super__Optional_base<long,_true,_true>.
                              _M_payload.super__Optional_payload_base<long>._12_4_,
                              output3.effective_value.super__Optional_base<long,_true,_true>.
                              _M_payload.super__Optional_payload_base<long>._8_4_);
        local_178 = output3.effective_value.super__Optional_base<long,_true,_true>._M_payload.
                    super__Optional_payload_base<long>._M_payload;
        local_168 = output3.fee.super__Optional_base<long,_true,_true>._M_payload.
                    super__Optional_payload_base<long>._M_payload;
        bStack_160 = output3.fee.super__Optional_base<long,_true,_true>._M_payload.
                     super__Optional_payload_base<long>._M_engaged;
        uStack_15f = output3.fee.super__Optional_base<long,_true,_true>._M_payload.
                     super__Optional_payload_base<long>._9_7_;
        local_158 = 0;
        local_150 = (tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                     super__Vector_impl_data._M_start)->nValue;
        prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
                  ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_148.indirect_contents,
                   &((tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                      super__Vector_impl_data._M_start)->scriptPubKey).super_CScriptBase);
        local_128 = 0xffffffff00000001;
        local_120 = 0x101;
        local_11e = 1;
        local_118 = 0;
        local_110 = 0;
        local_108 = 0;
        uStack_100 = 0;
        local_188._M_value = 0;
        p_Stack_180 = (_Storage<CFeeRate,_true> *)CONCAT71(p_Stack_180._1_7_,1);
        local_198 = (_Storage<long,_true>)pCVar1->nValue;
        uStack_190 = CONCAT31(uStack_190._1_3_,true);
        local_468 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
        ;
        local_460 = "";
        local_478 = &boost::unit_test::basic_cstring<char_const>::null;
        local_470 = &boost::unit_test::basic_cstring<char_const>::null;
        file_00.m_end = (iterator)0x438;
        file_00.m_begin = (iterator)&local_468;
        msg_00.m_end = pvVar4;
        msg_00.m_begin = pvVar3;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_478
                   ,msg_00);
        peStack_370 = (element_type *)((ulong)peStack_370 & 0xffffffffffffff00);
        local_378 = (undefined1  [8])&PTR__lazy_ostream_013abb30;
        sStack_368.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
        p_Stack_360 = (_Storage<long,_true> *)0xf6cf21;
        if (uStack_190._0_1_ != false) {
          local_500._0_8_ = &local_3e0;
          local_3e0._M_value = local_198._M_value;
          local_3d0._M_value = (long)&nValue;
          local_58[0] = local_198._M_value == nValue;
          peStack_50 = (element_type *)0x0;
          sStack_48.pi_ = (sp_counted_base *)0x0;
          local_398 = (_Storage<CFeeRate,_true>)0xf8004b;
          pcStack_390 = "";
          output3.effective_value.super__Optional_base<long,_true,_true>._M_payload.
          super__Optional_payload_base<long>._8_4_ =
               output3.effective_value.super__Optional_base<long,_true,_true>._M_payload.
               super__Optional_payload_base<long>._8_4_ & 0xffffff00;
          output3.effective_value.super__Optional_base<long,_true,_true>._M_payload.
          super__Optional_payload_base<long>._M_payload._M_value = (long)&PTR__lazy_ostream_013abed0
          ;
          output3.fee.super__Optional_base<long,_true,_true>._M_payload.
          super__Optional_payload_base<long>._M_payload._M_value =
               (long)boost::unit_test::lazy_ostream::inst;
          output4.effective_value.super__Optional_base<long,_true,_true>._M_payload.
          super__Optional_payload_base<long>._8_4_ =
               output4.effective_value.super__Optional_base<long,_true,_true>._M_payload.
               super__Optional_payload_base<long>._8_4_ & 0xffffff00;
          output4.effective_value.super__Optional_base<long,_true,_true>._M_payload.
          super__Optional_payload_base<long>._M_payload._M_value = (long)&PTR__lazy_ostream_013abed0
          ;
          output4.fee.super__Optional_base<long,_true,_true>._M_payload.
          super__Optional_payload_base<long>._M_payload._M_value =
               (long)boost::unit_test::lazy_ostream::inst;
          output4.fee.super__Optional_base<long,_true,_true>._M_payload.
          super__Optional_payload_base<long>._8_8_ = &local_3d0;
          output3.fee.super__Optional_base<long,_true,_true>._M_payload.
          super__Optional_payload_base<long>._8_8_ = &local_500;
          boost::test_tools::tt_detail::report_assertion
                    ((assertion_result *)local_58,(lazy_ostream *)local_378,1,2,REQUIRE,0xf80ffa,
                     (size_t)&local_398,0x438,&output3,"nValue",&output4);
          boost::detail::shared_count::~shared_count(&sStack_48);
          CMutableTransaction::GetHash((Txid *)local_378,&tx);
          peVar2 = peStack_370;
          output4.fee.super__Optional_base<long,_true,_true>._M_payload.
          super__Optional_payload_base<long>._M_payload._M_value = (long)sStack_368.pi_;
          output4.fee.super__Optional_base<long,_true,_true>._M_payload.
          super__Optional_payload_base<long>._8_8_ = p_Stack_360;
          output4.effective_value.super__Optional_base<long,_true,_true>._M_payload.
          super__Optional_payload_base<long>._M_payload._M_value = (long)local_378;
          output4.effective_value.super__Optional_base<long,_true,_true>._M_payload.
          super__Optional_payload_base<long>._M_engaged = peStack_370._0_1_;
          output4.effective_value.super__Optional_base<long,_true,_true>._M_payload.
          super__Optional_payload_base<long>._9_3_ = peStack_370._1_3_;
          output4.effective_value.super__Optional_base<long,_true,_true>._M_payload.
          super__Optional_payload_base<long>._12_4_ = peStack_370._4_4_;
          output4.outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0] = '\0';
          output4.outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[1] = '\0';
          output4.outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[2] = '\0';
          output4.outpoint.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[3] = '\0';
          peStack_370 = peVar2;
          if (tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
              super__Vector_impl_data._M_start) {
            if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_007bd8e0;
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0
                       ,0);
          }
          else {
            local_3b8 = 100000;
            uStack_3b0 = 1;
            feerate_00.super__Optional_base<CFeeRate,_true,_true>._M_payload.
            super__Optional_payload_base<CFeeRate>._9_7_ = uStack_3af;
            feerate_00.super__Optional_base<CFeeRate,_true,_true>._M_payload.
            super__Optional_payload_base<CFeeRate>._M_engaged = true;
            pvVar3 = (iterator)0x94;
            pvVar4 = (iterator)0x1;
            feerate_00.super__Optional_base<CFeeRate,_true,_true>._M_payload.
            super__Optional_payload_base<CFeeRate>._M_payload = (_Storage<CFeeRate,_true>)0x186a0;
            COutput::COutput(&output3,(COutPoint *)&output4,
                             tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                             super__Vector_impl_data._M_start,1,0x94,true,true,true,0,false,
                             feerate_00);
            expected_ev3 = -0x12c0;
            local_490 = 
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
            ;
            local_488 = "";
            local_4a0 = &boost::unit_test::basic_cstring<char_const>::null;
            local_498 = &boost::unit_test::basic_cstring<char_const>::null;
            file_01.m_end = (iterator)0x43d;
            file_01.m_begin = (iterator)&local_490;
            msg_01.m_end = pvVar4;
            msg_01.m_begin = pvVar3;
            boost::unit_test::unit_test_log_t::set_checkpoint
                      (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,
                       (size_t)&local_4a0,msg_01);
            peStack_50 = (element_type *)((ulong)peStack_50 & 0xffffffffffffff00);
            local_58 = (undefined1  [8])&PTR__lazy_ostream_013abb30;
            sStack_48.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
            p_Stack_40 = (_Storage<long,_true> *)0xf6cf21;
            if (output3.effective_value.super__Optional_base<long,_true,_true>._M_payload.
                super__Optional_payload_base<long>._M_engaged != false) {
              local_3d0._M_value = (long)&local_3e8;
              local_3e8 = output3.effective_value.super__Optional_base<long,_true,_true>._M_payload.
                          super__Optional_payload_base<long>._M_payload;
              local_3e0._M_value = (long)&expected_ev3;
              local_398._M_value.nSatoshisPerK._0_1_ =
                   output3.effective_value.super__Optional_base<long,_true,_true>._M_payload.
                   super__Optional_payload_base<long>._M_payload._M_value == expected_ev3;
              pcStack_390 = (char *)0x0;
              sStack_388.pi_ = (sp_counted_base *)0x0;
              local_500._0_8_ =
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
              ;
              local_500.m_message.px = (element_type *)0xf800bd;
              output4.effective_value.super__Optional_base<long,_true,_true>._M_payload.
              super__Optional_payload_base<long>._8_4_ =
                   output4.effective_value.super__Optional_base<long,_true,_true>._M_payload.
                   super__Optional_payload_base<long>._8_4_ & 0xffffff00;
              output4.effective_value.super__Optional_base<long,_true,_true>._M_payload.
              super__Optional_payload_base<long>._M_payload._M_value =
                   (long)&PTR__lazy_ostream_013abed0;
              output4.fee.super__Optional_base<long,_true,_true>._M_payload.
              super__Optional_payload_base<long>._M_payload._M_value =
                   (long)boost::unit_test::lazy_ostream::inst;
              peStack_370 = (element_type *)((ulong)peStack_370 & 0xffffffffffffff00);
              local_378 = (undefined1  [8])&PTR__lazy_ostream_013abed0;
              sStack_368.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
              p_Stack_360 = &local_3e0;
              output4.fee.super__Optional_base<long,_true,_true>._M_payload.
              super__Optional_payload_base<long>._8_8_ = &local_3d0;
              boost::test_tools::tt_detail::report_assertion
                        ((assertion_result *)&local_398._M_value,(lazy_ostream *)local_58,1,2,
                         REQUIRE,0xf81016,(size_t)&local_500,0x43d,&output4,"expected_ev3",
                         (Txid *)local_378);
              boost::detail::shared_count::~shared_count(&sStack_388);
              CMutableTransaction::GetHash((Txid *)local_58,&tx);
              pCVar1 = tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                       super__Vector_impl_data._M_start;
              sStack_368.pi_ = sStack_48.pi_;
              p_Stack_360 = p_Stack_40;
              local_378 = local_58;
              peStack_370 = peStack_50;
              local_358 = (_func_int **)((ulong)local_358._4_4_ << 0x20);
              if (tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                  super__Vector_impl_data._M_start) {
                if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_007bd8e0;
                std::__throw_out_of_range_fmt
                          ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                           ,0,0);
              }
              else {
                pcStack_390 = (char *)((ulong)pcStack_390 & 0xffffffffffffff00);
                pvVar3 = (iterator)0x94;
                pvVar4 = (iterator)0x1;
                feerate_01.super__Optional_base<CFeeRate,_true,_true>._M_payload.
                super__Optional_payload_base<CFeeRate>._8_8_ = pcStack_390;
                feerate_01.super__Optional_base<CFeeRate,_true,_true>._M_payload.
                super__Optional_payload_base<CFeeRate>._M_payload = local_398;
                COutput::COutput(&output4,(COutPoint *)local_378,
                                 tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl
                                 .super__Vector_impl_data._M_start,1,0x94,true,true,true,0,false,
                                 feerate_01);
                output4.fee.super__Optional_base<long,_true,_true>._M_payload.
                super__Optional_payload_base<long>._M_payload._M_value = 0x94;
                output4.fee.super__Optional_base<long,_true,_true>._M_payload.
                super__Optional_payload_base<long>._M_engaged = true;
                output4.effective_value.super__Optional_base<long,_true,_true>._M_payload.
                super__Optional_payload_base<long>._M_payload._M_value = pCVar1->nValue + -0x94;
                output4.effective_value.super__Optional_base<long,_true,_true>._M_payload.
                super__Optional_payload_base<long>._M_engaged = true;
                local_4b0 = 
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
                ;
                local_4a8 = "";
                local_4c0 = &boost::unit_test::basic_cstring<char_const>::null;
                local_4b8 = &boost::unit_test::basic_cstring<char_const>::null;
                file_02.m_end = (iterator)0x442;
                file_02.m_begin = (iterator)&local_4b0;
                msg_02.m_end = pvVar4;
                msg_02.m_begin = pvVar3;
                boost::unit_test::unit_test_log_t::set_checkpoint
                          (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,
                           (size_t)&local_4c0,msg_02);
                pcStack_390 = (char *)((ulong)pcStack_390 & 0xffffffffffffff00);
                local_398 = (_Storage<CFeeRate,_true>)&PTR__lazy_ostream_013abb30;
                sStack_388.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
                local_380._M_value = (long)"\x05\x04\x03\x02\x01" + 5;
                if (output4.effective_value.super__Optional_base<long,_true,_true>._M_payload.
                    super__Optional_payload_base<long>._M_engaged != false) {
                  local_3f0 = output4.effective_value.super__Optional_base<long,_true,_true>.
                              _M_payload.super__Optional_payload_base<long>._M_payload;
                  local_500.p_predicate_value.super_readonly_property<bool>.
                  super_class_property<bool>.value =
                       (readonly_property<bool>)
                       (readonly_property<bool>)
                       (output4.effective_value.super__Optional_base<long,_true,_true>._M_payload.
                        super__Optional_payload_base<long>._M_payload._M_value == expected_ev1);
                  local_500.m_message.px = (element_type *)0x0;
                  local_500.m_message.pn.pi_ = (sp_counted_base *)0x0;
                  local_3d0._M_value = 0xf8004b;
                  local_3c8 = "";
                  peStack_370 = (element_type *)((ulong)peStack_370 & 0xffffffffffffff00);
                  local_378 = (undefined1  [8])&PTR__lazy_ostream_013abed0;
                  sStack_368.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
                  p_Stack_360 = &local_3e0;
                  local_3e8._M_value = (long)&expected_ev1;
                  peStack_50 = (element_type *)((ulong)peStack_50 & 0xffffffffffffff00);
                  local_58 = (undefined1  [8])&PTR__lazy_ostream_013abed0;
                  sStack_48.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
                  p_Stack_40 = &local_3e8;
                  pvVar3 = (iterator)0x1;
                  pvVar4 = (iterator)0x2;
                  local_3e0._M_value = (long)&local_3f0;
                  boost::test_tools::tt_detail::report_assertion
                            (&local_500,(lazy_ostream *)&local_398._M_value,1,2,REQUIRE,0xf8103f,
                             (size_t)&local_3d0,0x442,(COutPoint *)local_378,"expected_ev1",
                             (Txid *)local_58);
                  boost::detail::shared_count::~shared_count(&local_500.m_message.pn);
                  CMutableTransaction::GetHash((Txid *)local_58,&tx);
                  if (tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                      super__Vector_impl_data._M_finish ==
                      tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                      super__Vector_impl_data._M_start) {
                    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_007bd8e0;
                    std::__throw_out_of_range_fmt
                              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                               ,0,0);
                  }
                  else {
                    peStack_370 = (element_type *)((ulong)peStack_370 & 0xffffffffffffff00);
                    p_Stack_360 = (_Storage<long,_true> *)((ulong)p_Stack_360 & 0xffffffffffffff00);
                    local_358 = (_func_int **)local_58;
                    peStack_350 = peStack_50;
                    local_348 = sStack_48.pi_;
                    p_Stack_340 = p_Stack_40;
                    local_338 = 0;
                    local_330 = (tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl
                                 .super__Vector_impl_data._M_start)->nValue;
                    prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
                              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                               &local_328.indirect_contents,
                               &((tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
                                  _M_impl.super__Vector_impl_data._M_start)->scriptPubKey).
                                super_CScriptBase);
                    local_308 = 0xffffffff00000001;
                    local_300 = 0x101;
                    local_2fe = 1;
                    local_2f8 = 0;
                    local_2f0 = 0;
                    local_2e8 = 0;
                    uStack_2e0 = 0;
                    sStack_368.pi_ = (sp_counted_base *)0x0;
                    p_Stack_360 = (_Storage<long,_true> *)CONCAT71(p_Stack_360._1_7_,1);
                    local_378 = (undefined1  [8])
                                (tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl
                                 .super__Vector_impl_data._M_start)->nValue;
                    peStack_370 = (element_type *)CONCAT71(peStack_370._1_7_,1);
                    local_4d0 = 
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
                    ;
                    local_4c8 = "";
                    local_4e0 = &boost::unit_test::basic_cstring<char_const>::null;
                    local_4d8 = &boost::unit_test::basic_cstring<char_const>::null;
                    file_03.m_end = (iterator)0x446;
                    file_03.m_begin = (iterator)&local_4d0;
                    msg_03.m_end = pvVar4;
                    msg_03.m_begin = pvVar3;
                    boost::unit_test::unit_test_log_t::set_checkpoint
                              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,
                               (size_t)&local_4e0,msg_03);
                    local_500.m_message.px =
                         (element_type *)((ulong)local_500.m_message.px & 0xffffffffffffff00);
                    local_500._0_8_ = &PTR__lazy_ostream_013abb30;
                    local_500.m_message.pn.pi_ =
                         (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
                    local_4e8 = "";
                    if (peStack_370._0_1_ != false) {
                      local_508 = (_func_int **)local_378;
                      local_3d0._M_value._0_1_ = local_378 == (undefined1  [8])nValue;
                      local_3c8 = (char *)0x0;
                      sStack_3c0.pi_ = (sp_counted_base *)0x0;
                      local_3e0._M_value = 0xf8004b;
                      local_3d8 = "";
                      peStack_50 = (element_type *)((ulong)peStack_50 & 0xffffffffffffff00);
                      local_58 = (undefined1  [8])&PTR__lazy_ostream_013abed0;
                      sStack_48.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
                      p_Stack_40 = &local_3e8;
                      pcStack_390 = (char *)((ulong)pcStack_390 & 0xffffffffffffff00);
                      local_398 = (_Storage<CFeeRate,_true>)&PTR__lazy_ostream_013abed0;
                      sStack_388.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
                      local_3f0._M_value = (long)&nValue;
                      local_3e8._M_value = (long)&local_508;
                      local_380._M_value = (long)&local_3f0;
                      boost::test_tools::tt_detail::report_assertion
                                ((assertion_result *)&local_3d0,(lazy_ostream *)&local_500,1,2,
                                 REQUIRE,0xf8105b,(size_t)&local_3e0,0x446,(Txid *)local_58,"nValue"
                                 ,&local_398);
                      boost::detail::shared_count::~shared_count(&sStack_3c0);
                      if (0x1c < local_30c) {
                        free(local_328.indirect_contents.indirect);
                        local_328.indirect_contents.indirect = (char *)0x0;
                      }
                      if (0x1c < output4.txout.scriptPubKey.super_CScriptBase._size) {
                        free(output4.txout.scriptPubKey.super_CScriptBase._union.indirect_contents.
                             indirect);
                        output4.txout.scriptPubKey.super_CScriptBase._union.indirect_contents.
                        indirect = (char *)0x0;
                      }
                      if (0x1c < output3.txout.scriptPubKey.super_CScriptBase._size) {
                        free(output3.txout.scriptPubKey.super_CScriptBase._union.indirect_contents.
                             indirect);
                        output3.txout.scriptPubKey.super_CScriptBase._union.indirect_contents.
                        indirect = (char *)0x0;
                      }
                      if (0x1c < local_12c) {
                        free(local_148.indirect_contents.indirect);
                        local_148.indirect_contents.indirect = (char *)0x0;
                      }
                      if (0x1c < output1.txout.scriptPubKey.super_CScriptBase._size) {
                        free(output1.txout.scriptPubKey.super_CScriptBase._union.indirect_contents.
                             indirect);
                        output1.txout.scriptPubKey.super_CScriptBase._union.indirect_contents.
                        indirect = (char *)0x0;
                      }
                      std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&tx.vout);
                      std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector(&tx.vin);
                      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                        return;
                      }
LAB_007bd8e0:
                      __stack_chk_fail();
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  __assert_fail("effective_value.has_value()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/coinselection.h"
                ,0x82,"CAmount wallet::COutput::GetEffectiveValue() const");
}

Assistant:

BOOST_AUTO_TEST_CASE(effective_value_test)
{
    const int input_bytes = 148;
    const CFeeRate feerate(1000);
    const CAmount nValue = 10000;
    const int nInput = 0;

    CMutableTransaction tx;
    tx.vout.resize(1);
    tx.vout[nInput].nValue = nValue;

    // standard case, pass feerate in constructor
    COutput output1(COutPoint(tx.GetHash(), nInput), tx.vout.at(nInput), /*depth=*/ 1, input_bytes, /*spendable=*/ true, /*solvable=*/ true, /*safe=*/ true, /*time=*/ 0, /*from_me=*/ false, feerate);
    const CAmount expected_ev1 = 9852; // 10000 - 148
    BOOST_CHECK_EQUAL(output1.GetEffectiveValue(), expected_ev1);

    // input bytes unknown (input_bytes = -1), pass feerate in constructor
    COutput output2(COutPoint(tx.GetHash(), nInput), tx.vout.at(nInput), /*depth=*/ 1, /*input_bytes=*/ -1, /*spendable=*/ true, /*solvable=*/ true, /*safe=*/ true, /*time=*/ 0, /*from_me=*/ false, feerate);
    BOOST_CHECK_EQUAL(output2.GetEffectiveValue(), nValue); // The effective value should be equal to the absolute value if input_bytes is -1

    // negative effective value, pass feerate in constructor
    COutput output3(COutPoint(tx.GetHash(), nInput), tx.vout.at(nInput), /*depth=*/ 1, input_bytes, /*spendable=*/ true, /*solvable=*/ true, /*safe=*/ true, /*time=*/ 0, /*from_me=*/ false, CFeeRate(100000));
    const CAmount expected_ev3 = -4800; // 10000 - 14800
    BOOST_CHECK_EQUAL(output3.GetEffectiveValue(), expected_ev3);

    // standard case, pass fees in constructor
    const CAmount fees = 148;
    COutput output4(COutPoint(tx.GetHash(), nInput), tx.vout.at(nInput), /*depth=*/ 1, input_bytes, /*spendable=*/ true, /*solvable=*/ true, /*safe=*/ true, /*time=*/ 0, /*from_me=*/ false, fees);
    BOOST_CHECK_EQUAL(output4.GetEffectiveValue(), expected_ev1);

    // input bytes unknown (input_bytes = -1), pass fees in constructor
    COutput output5(COutPoint(tx.GetHash(), nInput), tx.vout.at(nInput), /*depth=*/ 1, /*input_bytes=*/ -1, /*spendable=*/ true, /*solvable=*/ true, /*safe=*/ true, /*time=*/ 0, /*from_me=*/ false, /*fees=*/ 0);
    BOOST_CHECK_EQUAL(output5.GetEffectiveValue(), nValue); // The effective value should be equal to the absolute value if input_bytes is -1
}